

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QGraphicsAnchorLayout::removeAt(QGraphicsAnchorLayout *this,int index)

{
  QGraphicsAnchorLayoutPrivate *this_00;
  QGraphicsLayoutItem *item;
  Data *pDVar1;
  ulong uVar2;
  
  this_00 = (QGraphicsAnchorLayoutPrivate *)
            (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  uVar2 = (ulong)index;
  if ((uVar2 < (ulong)(this_00->items).d.size) &&
     (item = (this_00->items).d.ptr[uVar2], item != (QGraphicsLayoutItem *)0x0)) {
    QGraphicsAnchorLayoutPrivate::removeCenterConstraints(this_00,item,Horizontal);
    QGraphicsAnchorLayoutPrivate::removeCenterConstraints(this_00,item,Vertical);
    QGraphicsAnchorLayoutPrivate::removeAnchors(this_00,item);
    pDVar1 = (this_00->items).d.d;
    if ((pDVar1 == (Data *)0x0) || (1 < (int)(pDVar1->super_QArrayData).ref_._q_value)) {
      QArrayDataPointer<QGraphicsLayoutItem_*>::reallocateAndGrow
                (&(this_00->items).d,GrowsAtEnd,0,(QArrayDataPointer<QGraphicsLayoutItem_*> *)0x0);
    }
    QtPrivate::QPodArrayOps<QGraphicsLayoutItem_*>::erase
              ((QPodArrayOps<QGraphicsLayoutItem_*> *)&this_00->items,(this_00->items).d.ptr + uVar2
               ,1);
    QGraphicsLayoutItem::setParentLayoutItem(item,(QGraphicsLayoutItem *)0x0);
    (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }